

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

uint64_t __thiscall
capnp::compiler::Compiler::Impl::addNode(Impl *this,uint64_t desiredId,Node *node)

{
  Node *this_00;
  char *pcVar1;
  char (*in_R8) [23];
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false,_false>,_bool>
  pVar2;
  StringPtr error;
  StringPtr error_00;
  Array<char> local_68;
  undefined1 local_50 [32];
  
  while( true ) {
    local_50._0_8_ = desiredId;
    local_50._8_8_ = node;
    pVar2 = std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,capnp::compiler::Compiler::Node*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->nodesById,(CappedArray<char,_17UL> *)local_50);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    if ((long)desiredId < 0) {
      kj::hex((CappedArray<char,_17UL> *)local_50,desiredId);
      kj::str<char_const(&)[17],kj::CappedArray<char,17ul>,char_const(&)[2]>
                ((String *)&local_68,(kj *)"Duplicate ID @0x",(char (*) [17])local_50,
                 (CappedArray<char,_17UL> *)0x1db34d,(char (*) [2])in_R8);
      pcVar1 = "";
      if (local_68.size_ != 0) {
        pcVar1 = local_68.ptr;
      }
      error.content.size_ = local_68.size_ + (local_68.size_ == 0);
      error.content.ptr = pcVar1;
      Node::addError(node,error);
      kj::Array<char>::~Array(&local_68);
      this_00 = *(Node **)((long)pVar2.first.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                                 ._M_cur.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                          + 0x10);
      kj::hex((CappedArray<char,_17UL> *)local_50,desiredId);
      kj::str<char_const(&)[7],kj::CappedArray<char,17ul>,char_const(&)[23]>
                ((String *)&local_68,(kj *)0x1d9c9d,(char (*) [7])local_50,
                 (CappedArray<char,_17UL> *)" originally used here.",in_R8);
      pcVar1 = "";
      if (local_68.size_ != 0) {
        pcVar1 = local_68.ptr;
      }
      error_00.content.size_ = local_68.size_ + (local_68.size_ == 0);
      error_00.content.ptr = pcVar1;
      Node::addError(this_00,error_00);
      kj::Array<char>::~Array(&local_68);
    }
    desiredId = this->nextBogusId;
    this->nextBogusId = desiredId + 1;
  }
  return desiredId;
}

Assistant:

uint64_t Compiler::Impl::addNode(uint64_t desiredId, Node& node) {
  for (;;) {
    auto insertResult = nodesById.insert(std::make_pair(desiredId, &node));
    if (insertResult.second) {
      return desiredId;
    }

    // Only report an error if this ID is not bogus.  Actual IDs specified in the original source
    // code are required to have the upper bit set.  Anything else must have been manufactured
    // at some point to cover up an error.
    if (desiredId & (1ull << 63)) {
      node.addError(kj::str("Duplicate ID @0x", kj::hex(desiredId), "."));
      insertResult.first->second->addError(
          kj::str("ID @0x", kj::hex(desiredId), " originally used here."));
    }

    // Assign a new bogus ID.
    desiredId = nextBogusId++;
  }
}